

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void address_space_set_flatview(AddressSpace *as)

{
  MemoryRegion *view;
  MemoryRegion_conflict *key;
  MemoryRegion *local_58;
  FlatView *old_view2;
  FlatView tmpview;
  FlatView *new_view;
  MemoryRegion_conflict *physmr;
  FlatView *old_view;
  AddressSpace *as_local;
  
  view = (MemoryRegion *)address_space_to_flatview(as);
  key = memory_region_get_flatview_root(as->root);
  tmpview.root = (MemoryRegion *)g_hash_table_lookup(as->uc->flat_views,key);
  if (tmpview.root == (MemoryRegion *)0x0) {
    __assert_fail("new_view",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                  ,0x3a9,"void address_space_set_flatview(AddressSpace *)");
  }
  if (view != tmpview.root) {
    flatview_ref((FlatView *)tmpview.root);
    if ((as->listeners).tqh_first != (MemoryListener *)0x0) {
      memset(&old_view2,0,0x28);
      local_58 = view;
      if (view == (MemoryRegion *)0x0) {
        local_58 = (MemoryRegion *)&old_view2;
      }
      address_space_update_topology_pass(as,(FlatView *)local_58,(FlatView *)tmpview.root,false);
      address_space_update_topology_pass(as,(FlatView *)local_58,(FlatView *)tmpview.root,true);
    }
    as->current_map = (FlatView *)tmpview.root;
    if (view != (MemoryRegion *)0x0) {
      flatview_unref_tricore((FlatView *)view);
    }
  }
  return;
}

Assistant:

static void address_space_set_flatview(AddressSpace *as)
{
    FlatView *old_view = address_space_to_flatview(as);
    MemoryRegion *physmr = memory_region_get_flatview_root(as->root);
    FlatView *new_view = g_hash_table_lookup(as->uc->flat_views, physmr);

    assert(new_view);

    if (old_view == new_view) {
        return;
    }

    flatview_ref(new_view);
    if (!QTAILQ_EMPTY(&as->listeners)) {
        FlatView tmpview = { .nr = 0 }, *old_view2 = old_view;

        if (!old_view2) {
            old_view2 = &tmpview;
        }
        address_space_update_topology_pass(as, old_view2, new_view, false);
        address_space_update_topology_pass(as, old_view2, new_view, true);
    }

    as->current_map = new_view;
    if (old_view) {
        flatview_unref(old_view);
    }
}